

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDForceModifier.cpp
# Opt level: O0

void __thiscall OpenMD::LDForceModifier::LDForceModifier(LDForceModifier *this,SimInfo *info)

{
  bool bVar1;
  Globals *pGVar2;
  size_t sVar3;
  void *pvVar4;
  undefined8 uVar5;
  AtomType *pAVar6;
  SimInfo *in_RSI;
  ForceModifier *in_RDI;
  SimInfo *pSVar7;
  _func_int **pp_Var8;
  RealType RVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>,_bool>
  pVar10;
  string *in_stack_000000f0;
  HydroIO *in_stack_000000f8;
  RealType stdDev;
  iterator iter_1;
  HydroProp *currHydroProp;
  iterator i_1;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> atChain;
  int aNum;
  LennardJonesAdapter lja;
  GayBerneAdapter gba;
  AtomType *atomType;
  Atom *atom;
  Shape *currShape;
  iterator iter;
  HydroIO *hio;
  RigidBody *rb;
  bool needHydroPropFile;
  IntegrableObjectIterator j;
  MoleculeIterator i;
  StuntDouble *sd;
  Molecule *mol;
  RealType dt;
  Globals *in_stack_fffffffffffffa48;
  HydroProp *in_stack_fffffffffffffa50;
  Molecule *in_stack_fffffffffffffa58;
  Atom *in_stack_fffffffffffffa60;
  AtomType *in_stack_fffffffffffffa68;
  SimInfo *in_stack_fffffffffffffa70;
  MomentData *in_stack_fffffffffffffa78;
  undefined7 in_stack_fffffffffffffa80;
  undefined1 in_stack_fffffffffffffa87;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>
  in_stack_fffffffffffffa88;
  Ellipsoid *in_stack_fffffffffffffa90;
  AtomType *in_stack_fffffffffffffac8;
  SimInfo *local_338;
  _func_int **local_330;
  SimInfo *local_328;
  undefined1 local_320;
  string local_2f8 [72];
  MomentData *local_2b0;
  _Self local_2a8;
  string local_2a0 [32];
  _Self local_280;
  undefined8 local_278;
  string local_258 [32];
  AtomType **local_238;
  AtomType **local_230;
  __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
  local_228 [4];
  int local_204;
  StuntDouble *in_stack_fffffffffffffe00;
  LDForceModifier *in_stack_fffffffffffffe08;
  LennardJonesAdapter local_1e8;
  undefined1 local_1d9;
  GayBerneAdapter local_130;
  AtomType *local_128;
  Atom *local_120;
  AtomType *local_118;
  string local_110 [32];
  MomentData *local_f0;
  _Self local_e8;
  string local_e0 [32];
  _Self local_c0;
  string local_b8 [80];
  void *local_68;
  Atom *local_60;
  byte local_51;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_50;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_48;
  Atom *local_40;
  Molecule *local_38;
  RealType local_28;
  SimInfo *local_10;
  
  local_10 = in_RSI;
  ForceModifier::ForceModifier(in_RDI,in_RSI);
  in_RDI->_vptr_ForceModifier = (_func_int **)&PTR__LDForceModifier_0050c0a8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
         *)0x38c927);
  std::vector<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>::vector
            ((vector<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_> *)0x38c940);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MomentData_*>_>_>
         *)0x38c959);
  std::vector<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>::vector
            ((vector<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_> *)0x38c975);
  *(undefined4 *)&in_RDI[10]._vptr_ForceModifier = 6;
  in_RDI[10].info_ = (SimInfo *)0x3eb0c6f7a0b5ed8d;
  SimInfo::getRandomNumberGenerator((SimInfo *)in_stack_fffffffffffffa48);
  std::normal_distribution<double>::normal_distribution((normal_distribution<double> *)0x38c9ca);
  pGVar2 = SimInfo::getSimParams(local_10);
  in_RDI[0x10]._vptr_ForceModifier = (_func_int **)pGVar2;
  std::unique_ptr<OpenMD::Velocitizer,std::default_delete<OpenMD::Velocitizer>>::
  unique_ptr<std::default_delete<OpenMD::Velocitizer>,void>
            ((unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *)
             in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  local_28 = Globals::getDt((Globals *)0x38ca40);
  in_RDI[0xb]._vptr_ForceModifier = (_func_int **)(local_28 * 0.5);
  std::make_unique<OpenMD::Velocitizer,OpenMD::SimInfo*&>((SimInfo **)in_stack_fffffffffffffa68);
  std::unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>::operator=
            ((unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *)
             in_stack_fffffffffffffa50,
             (unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *)
             in_stack_fffffffffffffa48);
  std::unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>::~unique_ptr
            ((unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *)
             in_stack_fffffffffffffa50);
  *(undefined1 *)&in_RDI[0xf].info_ = 0;
  bVar1 = Globals::getUseSphericalBoundaryConditions((Globals *)0x38cae1);
  if (bVar1) {
    *(undefined1 *)&in_RDI[0xf].info_ = 1;
    bVar1 = Globals::haveLangevinBufferRadius((Globals *)0x38cb15);
    if (bVar1) {
      pSVar7 = (SimInfo *)Globals::getLangevinBufferRadius((Globals *)0x38cb42);
      in_RDI[0xe].info_ = pSVar7;
    }
    else {
      snprintf(painCave.errMsg,2000,
               "langevinBufferRadius must be specified when useSphericalBoundaryConditions is turned on.\n"
              );
      painCave.severity = 1;
      painCave.isFatal = 1;
      simError();
    }
    bVar1 = Globals::haveFrozenBufferRadius((Globals *)0x38cc11);
    if (bVar1) {
      pp_Var8 = (_func_int **)Globals::getFrozenBufferRadius((Globals *)0x38cc3b);
      in_RDI[0xf]._vptr_ForceModifier = pp_Var8;
    }
    else {
      snprintf(painCave.errMsg,2000,
               "frozenBufferRadius must be specified when useSphericalBoundaryConditions is turned on.\n"
              );
      painCave.severity = 1;
      painCave.isFatal = 1;
      simError();
    }
    if ((double)in_RDI[0xf]._vptr_ForceModifier < (double)in_RDI[0xe].info_) {
      snprintf(painCave.errMsg,2000,
               "frozenBufferRadius has been set smaller than the langevinBufferRadius.  This is probably an error.\n"
              );
      painCave.severity = 2;
      painCave.isFatal = 0;
      simError();
    }
  }
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_48);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_50);
  local_51 = 0;
  local_38 = SimInfo::beginMolecule
                       (in_stack_fffffffffffffa70,(MoleculeIterator *)in_stack_fffffffffffffa68);
  while (local_38 != (Molecule *)0x0) {
    local_40 = (Atom *)Molecule::beginIntegrableObject
                                 ((Molecule *)in_stack_fffffffffffffa70,
                                  (iterator *)in_stack_fffffffffffffa68);
    while (local_40 != (Atom *)0x0) {
      bVar1 = StuntDouble::isRigidBody(&local_40->super_StuntDouble);
      if (bVar1) {
        local_60 = local_40;
        sVar3 = RigidBody::getNumAtoms((RigidBody *)0x38cdf9);
        if (1 < sVar3) {
          local_51 = 1;
        }
      }
      local_40 = (Atom *)Molecule::nextIntegrableObject
                                   ((Molecule *)in_stack_fffffffffffffa70,
                                    (iterator *)in_stack_fffffffffffffa68);
    }
    local_38 = SimInfo::nextMolecule
                         (in_stack_fffffffffffffa70,(MoleculeIterator *)in_stack_fffffffffffffa68);
  }
  if ((local_51 & 1) == 0) {
    local_38 = SimInfo::beginMolecule
                         (in_stack_fffffffffffffa70,(MoleculeIterator *)in_stack_fffffffffffffa68);
    while (local_38 != (Molecule *)0x0) {
      local_40 = (Atom *)Molecule::beginIntegrableObject
                                   ((Molecule *)in_stack_fffffffffffffa70,
                                    (iterator *)in_stack_fffffffffffffa68);
      while (local_40 != (Atom *)0x0) {
        local_118 = (AtomType *)0x0;
        bVar1 = StuntDouble::isAtom(&local_40->super_StuntDouble);
        if (bVar1) {
          local_120 = local_40;
          local_128 = Atom::getAtomType(local_40);
          GayBerneAdapter::GayBerneAdapter(&local_130,local_128);
          bVar1 = GayBerneAdapter::isGayBerne((GayBerneAdapter *)0x38d3fa);
          if (bVar1) {
            pAVar6 = (AtomType *)operator_new(0xa8);
            local_1d9 = 1;
            Vector3<double>::Vector3
                      ((Vector3<double> *)in_stack_fffffffffffffa50,
                       (Vector3<double> *)in_stack_fffffffffffffa48);
            GayBerneAdapter::getL((GayBerneAdapter *)in_stack_fffffffffffffa70);
            GayBerneAdapter::getD((GayBerneAdapter *)in_stack_fffffffffffffa70);
            SquareMatrix<double,_3>::identity();
            SquareMatrix3<double>::SquareMatrix3
                      ((SquareMatrix3<double> *)in_stack_fffffffffffffa50,
                       (SquareMatrix<double,_3> *)in_stack_fffffffffffffa48);
            Ellipsoid::Ellipsoid
                      (in_stack_fffffffffffffa90,(Vector3d *)in_stack_fffffffffffffa88._M_node,
                       (RealType)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                       (RealType)in_stack_fffffffffffffa78,(Mat3x3d *)in_stack_fffffffffffffa70);
            local_1d9 = 0;
            local_118 = pAVar6;
            SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x38d52d);
            SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x38d53a);
          }
          else {
            LennardJonesAdapter::LennardJonesAdapter(&local_1e8,local_128);
            bVar1 = LennardJonesAdapter::isLennardJones((LennardJonesAdapter *)0x38d5e0);
            if (bVar1) {
              pAVar6 = (AtomType *)operator_new(0x48);
              Vector3<double>::Vector3
                        ((Vector3<double> *)in_stack_fffffffffffffa50,
                         (Vector3<double> *)in_stack_fffffffffffffa48);
              LennardJonesAdapter::getSigma((LennardJonesAdapter *)in_stack_fffffffffffffa60);
              Sphere::Sphere((Sphere *)in_stack_fffffffffffffa70,
                             (Vector3d *)in_stack_fffffffffffffa68,
                             (RealType)in_stack_fffffffffffffa60);
              local_118 = pAVar6;
            }
            else {
              local_204 = 0;
              AtomType::allYourBase(in_stack_fffffffffffffac8);
              __gnu_cxx::
              __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
              ::__normal_iterator(local_228);
              local_230 = (AtomType **)
                          std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::
                          begin((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                                in_stack_fffffffffffffa48);
              local_228[0]._M_current = local_230;
              while( true ) {
                local_238 = (AtomType **)
                            std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::
                            end((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                                in_stack_fffffffffffffa48);
                bVar1 = __gnu_cxx::operator!=
                                  ((__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                                    *)in_stack_fffffffffffffa50,
                                   (__normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                                    *)in_stack_fffffffffffffa48);
                if (!bVar1) break;
                __gnu_cxx::
                __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                ::operator*(local_228);
                AtomType::getName_abi_cxx11_((AtomType *)in_stack_fffffffffffffa48);
                std::__cxx11::string::c_str();
                local_204 = ElementsTable::GetAtomicNum
                                      ((ElementsTable *)in_stack_fffffffffffffa50,
                                       (char *)in_stack_fffffffffffffa48);
                std::__cxx11::string::~string(local_258);
                if (local_204 != 0) {
                  pAVar6 = (AtomType *)operator_new(0x48);
                  Vector3<double>::Vector3
                            ((Vector3<double> *)in_stack_fffffffffffffa50,
                             (Vector3<double> *)in_stack_fffffffffffffa48);
                  ElementsTable::GetVdwRad
                            ((ElementsTable *)in_stack_fffffffffffffa58,
                             (int)((ulong)in_stack_fffffffffffffa50 >> 0x20));
                  Sphere::Sphere((Sphere *)in_stack_fffffffffffffa70,
                                 (Vector3d *)in_stack_fffffffffffffa68,
                                 (RealType)in_stack_fffffffffffffa60);
                  local_118 = pAVar6;
                  break;
                }
                __gnu_cxx::
                __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
                ::operator++(local_228);
              }
              if (local_204 == 0) {
                snprintf(painCave.errMsg,2000,"Could not find atom type in default element.txt\n");
                painCave.severity = 1;
                painCave.isFatal = 1;
                simError();
              }
              std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::~vector
                        ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)
                         in_stack_fffffffffffffa60);
            }
          }
        }
        bVar1 = Globals::haveTargetTemp((Globals *)0x38d91a);
        if (!bVar1) {
          snprintf(painCave.errMsg,2000,"You can\'t use LangevinDynamics without a targetTemp!\n");
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        bVar1 = Globals::haveViscosity((Globals *)0x38d98b);
        if (!bVar1) {
          snprintf(painCave.errMsg,2000,"You can\'t use LangevinDynamics without a viscosity!\n");
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        in_stack_fffffffffffffac8 = local_118;
        RVar9 = Globals::getViscosity((Globals *)0x38da0c);
        local_278 = (**(code **)((long)((Vector<double,_3U> *)
                                       &in_stack_fffffffffffffac8->_vptr_AtomType)->data_[0] + 0x28)
                    )(RVar9);
        (*(local_40->super_StuntDouble)._vptr_StuntDouble[7])(local_2a0);
        local_280._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                     *)in_stack_fffffffffffffa48,(key_type *)0x38da83);
        std::__cxx11::string::~string(local_2a0);
        local_2a8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                    *)in_stack_fffffffffffffa48);
        bVar1 = std::operator!=(&local_280,&local_2a8);
        if (bVar1) {
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>
          ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>
                        *)0x38daf9);
          std::vector<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>::push_back
                    ((vector<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_> *)
                     in_stack_fffffffffffffa60,(value_type *)in_stack_fffffffffffffa58);
          local_2b0 = getMomentData(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
          std::vector<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>::push_back
                    ((vector<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_> *)
                     in_stack_fffffffffffffa50,(value_type *)in_stack_fffffffffffffa48);
        }
        else {
          HydroProp::complete(in_stack_fffffffffffffa50);
          in_stack_fffffffffffffa90 = (Ellipsoid *)(in_RDI + 1);
          (*(local_40->super_StuntDouble)._vptr_StuntDouble[7])(local_2f8);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*&,_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>
                      *)in_stack_fffffffffffffa60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa58,(HydroProp **)in_stack_fffffffffffffa50);
          pVar10 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                   ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                             *)in_stack_fffffffffffffa60,(value_type *)in_stack_fffffffffffffa58);
          in_stack_fffffffffffffa88 = pVar10.first._M_node;
          in_stack_fffffffffffffa87 = pVar10.second;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>
                   *)0x38dc1e);
          std::__cxx11::string::~string(local_2f8);
          std::vector<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>::push_back
                    ((vector<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_> *)
                     in_stack_fffffffffffffa60,(value_type *)in_stack_fffffffffffffa58);
          in_stack_fffffffffffffa70 = (SimInfo *)&in_RDI[8].info_;
          in_stack_fffffffffffffa78 =
               getMomentData(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
          std::vector<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>::push_back
                    ((vector<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_> *)
                     in_stack_fffffffffffffa50,(value_type *)in_stack_fffffffffffffa48);
        }
        in_stack_fffffffffffffa68 = local_118;
        if (local_118 != (AtomType *)0x0) {
          (**(code **)((long)((Vector<double,_3U> *)&local_118->_vptr_AtomType)->data_[0] + 8))();
        }
        in_stack_fffffffffffffa60 =
             (Atom *)Molecule::nextIntegrableObject
                               ((Molecule *)in_stack_fffffffffffffa70,
                                (iterator *)in_stack_fffffffffffffa68);
        local_40 = in_stack_fffffffffffffa60;
      }
      in_stack_fffffffffffffa58 =
           SimInfo::nextMolecule
                     (in_stack_fffffffffffffa70,(MoleculeIterator *)in_stack_fffffffffffffa68);
      local_38 = in_stack_fffffffffffffa58;
    }
  }
  else {
    bVar1 = Globals::haveHydroPropFile((Globals *)0x38cead);
    if (bVar1) {
      pvVar4 = operator_new(0xc0);
      HydroIO::HydroIO((HydroIO *)in_stack_fffffffffffffa70);
      local_68 = pvVar4;
      Globals::getHydroPropFile_abi_cxx11_(in_stack_fffffffffffffa48);
      HydroIO::parseHydroFile(in_stack_000000f8,in_stack_000000f0);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
      ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                   *)in_stack_fffffffffffffa50,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                   *)in_stack_fffffffffffffa48);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
              *)0x38cf6c);
      std::__cxx11::string::~string(local_b8);
    }
    else {
      snprintf(painCave.errMsg,2000,
               "HydroPropFile must be set to a file name if Langevin Dynamics\n\tis specified for rigidBodies which contain more than one atom\n\tTo create a HydroPropFile, run the \"Hydro\" program.\n"
              );
      painCave.severity = 1;
      painCave.isFatal = 1;
      simError();
    }
    local_38 = SimInfo::beginMolecule
                         (in_stack_fffffffffffffa70,(MoleculeIterator *)in_stack_fffffffffffffa68);
    while (local_38 != (Molecule *)0x0) {
      local_40 = (Atom *)Molecule::beginIntegrableObject
                                   ((Molecule *)in_stack_fffffffffffffa70,
                                    (iterator *)in_stack_fffffffffffffa68);
      while (local_40 != (Atom *)0x0) {
        (*(local_40->super_StuntDouble)._vptr_StuntDouble[7])(local_e0);
        local_c0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                     *)in_stack_fffffffffffffa48,(key_type *)0x38d0da);
        std::__cxx11::string::~string(local_e0);
        local_e8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>_>
                    *)in_stack_fffffffffffffa48);
        bVar1 = std::operator!=(&local_c0,&local_e8);
        if (bVar1) {
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>
          ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::HydroProp_*>_>
                        *)0x38d159);
          std::vector<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>::push_back
                    ((vector<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_> *)
                     in_stack_fffffffffffffa60,(value_type *)in_stack_fffffffffffffa58);
          local_f0 = getMomentData(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
          std::vector<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>::push_back
                    ((vector<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_> *)
                     in_stack_fffffffffffffa50,(value_type *)in_stack_fffffffffffffa48);
        }
        else {
          (*(local_40->super_StuntDouble)._vptr_StuntDouble[7])(local_110);
          uVar5 = std::__cxx11::string::c_str();
          snprintf(painCave.errMsg,2000,"Can not find resistance tensor for atom [%s]\n",uVar5);
          std::__cxx11::string::~string(local_110);
          painCave.severity = 1;
          painCave.isFatal = 1;
          simError();
        }
        local_40 = (Atom *)Molecule::nextIntegrableObject
                                     ((Molecule *)in_stack_fffffffffffffa70,
                                      (iterator *)in_stack_fffffffffffffa68);
      }
      local_38 = SimInfo::nextMolecule
                           (in_stack_fffffffffffffa70,(MoleculeIterator *)in_stack_fffffffffffffa68)
      ;
    }
  }
  RVar9 = Globals::getTargetTemp((Globals *)0x38dd74);
  sqrt((RVar9 * 0.0039744312) / local_28);
  std::normal_distribution<double>::normal_distribution
            ((normal_distribution<double> *)in_stack_fffffffffffffa60,
             (result_type_conflict1)in_stack_fffffffffffffa58,RVar9);
  in_RDI[0xc].info_ = local_338;
  in_RDI[0xd]._vptr_ForceModifier = local_330;
  in_RDI[0xd].info_ = local_328;
  *(undefined1 *)&in_RDI[0xe]._vptr_ForceModifier = local_320;
  return;
}

Assistant:

LDForceModifier::LDForceModifier(SimInfo* info) :
      ForceModifier {info}, maxIterNum_ {6}, forceTolerance_ {1e-6},
      randNumGen_ {info->getRandomNumberGenerator()},
      simParams_ {info->getSimParams()} {
    RealType dt = simParams_->getDt();
    dt2_        = dt * 0.5;

    veloMunge_ = std::make_unique<Velocitizer>(info_);

    sphericalBoundaryConditions_ = false;
    if (simParams_->getUseSphericalBoundaryConditions()) {
      sphericalBoundaryConditions_ = true;
      if (simParams_->haveLangevinBufferRadius()) {
        langevinBufferRadius_ = simParams_->getLangevinBufferRadius();
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "langevinBufferRadius must be specified "
                 "when useSphericalBoundaryConditions is turned on.\n");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }

      if (simParams_->haveFrozenBufferRadius()) {
        frozenBufferRadius_ = simParams_->getFrozenBufferRadius();
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "frozenBufferRadius must be specified "
                 "when useSphericalBoundaryConditions is turned on.\n");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }

      if (frozenBufferRadius_ < langevinBufferRadius_) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "frozenBufferRadius has been set smaller than the "
                 "langevinBufferRadius.  This is probably an error.\n");
        painCave.severity = OPENMD_WARNING;
        painCave.isFatal  = 0;
        simError();
      }
    }

    // Build the hydroProp_ map:
    Molecule* mol;
    StuntDouble* sd;
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    bool needHydroPropFile = false;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        if (sd->isRigidBody()) {
          RigidBody* rb = static_cast<RigidBody*>(sd);
          if (rb->getNumAtoms() > 1) needHydroPropFile = true;
        }
      }
    }

    if (needHydroPropFile) {
      if (simParams_->haveHydroPropFile()) {
        HydroIO* hio  = new HydroIO();
        hydroPropMap_ = hio->parseHydroFile(simParams_->getHydroPropFile());
      } else {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "HydroPropFile must be set to a file name if Langevin Dynamics\n"
            "\tis specified for rigidBodies which contain more than one atom\n"
            "\tTo create a HydroPropFile, run the \"Hydro\" program.\n");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          map<string, HydroProp*>::iterator iter =
              hydroPropMap_.find(sd->getType());
          if (iter != hydroPropMap_.end()) {
            hydroProps_.push_back(iter->second);
            moments_.push_back(getMomentData(sd));

          } else {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "Can not find resistance tensor for atom [%s]\n",
                     sd->getType().c_str());
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          }
        }
      }

    } else {
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          Shape* currShape = NULL;

          if (sd->isAtom()) {
            Atom* atom          = static_cast<Atom*>(sd);
            AtomType* atomType  = atom->getAtomType();
            GayBerneAdapter gba = GayBerneAdapter(atomType);
            if (gba.isGayBerne()) {
              currShape = new Ellipsoid(V3Zero, gba.getL() / 2.0,
                                        gba.getD() / 2.0, Mat3x3d::identity());
            } else {
              LennardJonesAdapter lja = LennardJonesAdapter(atomType);
              if (lja.isLennardJones()) {
                currShape = new Sphere(V3Zero, lja.getSigma() / 2.0);
              } else {
                int aNum(0);
                vector<AtomType*> atChain = atomType->allYourBase();
                vector<AtomType*>::iterator i;
                for (i = atChain.begin(); i != atChain.end(); ++i) {
                  aNum = etab.GetAtomicNum((*i)->getName().c_str());
                  if (aNum != 0) {
                    currShape = new Sphere(V3Zero, etab.GetVdwRad(aNum));
                    break;
                  }
                }
                if (aNum == 0) {
                  snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                           "Could not find atom type in default element.txt\n");
                  painCave.severity = OPENMD_ERROR;
                  painCave.isFatal  = 1;
                  simError();
                }
              }
            }
          }

          if (!simParams_->haveTargetTemp()) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "You can't use LangevinDynamics without a targetTemp!\n");
            painCave.isFatal  = 1;
            painCave.severity = OPENMD_ERROR;
            simError();
          }

          if (!simParams_->haveViscosity()) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "You can't use LangevinDynamics without a viscosity!\n");
            painCave.isFatal  = 1;
            painCave.severity = OPENMD_ERROR;
            simError();
          }

          HydroProp* currHydroProp =
              currShape->getHydroProp(simParams_->getViscosity());
          map<string, HydroProp*>::iterator iter =
              hydroPropMap_.find(sd->getType());
          if (iter != hydroPropMap_.end()) {
            hydroProps_.push_back(iter->second);
            moments_.push_back(getMomentData(sd));

          } else {
            currHydroProp->complete();
            hydroPropMap_.insert(map<string, HydroProp*>::value_type(
                sd->getType(), currHydroProp));
            hydroProps_.push_back(currHydroProp);
            moments_.push_back(getMomentData(sd));
          }
          delete currShape;
        }
      }
    }

    RealType stdDev =
        std::sqrt(2.0 * Constants::kb * simParams_->getTargetTemp() / dt);

    forceDistribution_ = std::normal_distribution<RealType>(0.0, stdDev);
  }